

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTessellationMaxInOut::retrieveGLConstantValues
          (TessellationShaderTessellationMaxInOut *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  NotSupportedError *pNVar6;
  allocator<char> local_519;
  string local_518;
  MessageBuilder local_4f8;
  undefined1 local_372;
  allocator<char> local_371;
  string local_370;
  MessageBuilder local_350;
  undefined1 local_1ca;
  allocator<char> local_1c9;
  string local_1c8;
  MessageBuilder local_198;
  long local_18;
  Functions *gl;
  TessellationShaderTessellationMaxInOut *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar1);
  (**(code **)(local_18 + 0x868))(0x9122,&this->m_gl_max_vertex_output_components_value);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_VERTEX_OUTPUT_COMPONENTS pname!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xac7);
  (**(code **)(local_18 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_CONTROL_INPUT_COMPONENTS,
             &this->m_gl_max_tess_control_input_components_value);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT pname!"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xaca);
  (**(code **)(local_18 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_CONTROL_OUTPUT_COMPONENTS,
             &this->m_gl_max_tess_control_output_components_value);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,
                  "glGetIntegerv() failed for GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT pname!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xacd);
  (**(code **)(local_18 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_PATCH_COMPONENTS,
             &this->m_gl_max_tess_patch_components_value);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_TESS_PATCH_COMPONENTS_EXT pname!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xad0);
  (**(code **)(local_18 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_EVALUATION_INPUT_COMPONENTS,
             &this->m_gl_max_tess_evaluation_input_components_value);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,
                  "glGetIntegerv() failed for GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS_EXT pname!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xad4);
  (**(code **)(local_18 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_EVALUATION_OUTPUT_COMPONENTS,
             &this->m_gl_max_tess_evaluation_output_components_value);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,
                  "glGetIntegerv() failed for GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT pname!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xad9);
  (**(code **)(local_18 + 0x868))
            (0x8c8a,&this->m_gl_max_transform_feedback_interleaved_components_value);
  dVar2 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar2,
                  "glGetIntegerv() failed for GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS pname!"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xade);
  if (this->m_gl_max_vertex_output_components_value <
      this->m_gl_max_tess_control_input_components_value) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_198,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_198,(char (*) [48])"Warning: GL_MAX_VERTEX_OUTPUT_COMPONENTS value:")
    ;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_gl_max_vertex_output_components_value);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [57])
                               " is less than GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT: ");
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,&this->m_gl_max_tess_control_input_components_value);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [151])
                               ". It may not be possible to pass all GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT per-vertex components from Vertex Shader to Tessellation Control Shader."
                       );
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_198);
    local_1ca = 1;
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,
               "GL_MAX_VERTEX_OUTPUT_COMPONENTS < GL_MAX_TESS_CONTROL_INPUT_COMPONENTS",&local_1c9);
    tcu::NotSupportedError::NotSupportedError(pNVar6,&local_1c8);
    local_1ca = 0;
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (this->m_gl_max_tess_control_output_components_value !=
      this->m_gl_max_tess_evaluation_input_components_value) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_350,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_350,
                        (char (*) [52])"Warning: GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT:");
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,&this->m_gl_max_tess_control_output_components_value);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [62])
                               " is not equal to GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS_EXT:");
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,&this->m_gl_max_tess_evaluation_input_components_value);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [169])
                               ". It may not be possible to pass all GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT per-vertex components from Tessellation Control Shader to Tessellation Evaluation Shader."
                       );
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_350);
    local_372 = 1;
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,
               "GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS != GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS",
               &local_371);
    tcu::NotSupportedError::NotSupportedError(pNVar6,&local_370);
    local_372 = 0;
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (this->m_gl_max_transform_feedback_interleaved_components_value <
      this->m_gl_max_tess_evaluation_output_components_value) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4f8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_4f8,
                        (char (*) [55])"Warning: GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT:");
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,&this->m_gl_max_tess_evaluation_output_components_value);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [67])
                               " is greater than GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS:")
    ;
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,&this->m_gl_max_transform_feedback_interleaved_components_value);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [142])
                               ". It may not be possible to check all GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT per-vertex components from Tessellation Evaluation Shader."
                       );
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4f8);
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_518,
               "GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS > GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS"
               ,&local_519);
    tcu::NotSupportedError::NotSupportedError(pNVar6,&local_518);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  return;
}

Assistant:

void TessellationShaderTessellationMaxInOut::retrieveGLConstantValues(void)
{
	/* Retrieve ES entry-points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Query implementation constants */
	gl.getIntegerv(GL_MAX_VERTEX_OUTPUT_COMPONENTS, &m_gl_max_vertex_output_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_VERTEX_OUTPUT_COMPONENTS pname!");

	gl.getIntegerv(m_glExtTokens.MAX_TESS_CONTROL_INPUT_COMPONENTS, &m_gl_max_tess_control_input_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT pname!");

	gl.getIntegerv(m_glExtTokens.MAX_TESS_CONTROL_OUTPUT_COMPONENTS, &m_gl_max_tess_control_output_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT pname!");

	gl.getIntegerv(m_glExtTokens.MAX_TESS_PATCH_COMPONENTS, &m_gl_max_tess_patch_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_PATCH_COMPONENTS_EXT pname!");

	gl.getIntegerv(m_glExtTokens.MAX_TESS_EVALUATION_INPUT_COMPONENTS,
				   &m_gl_max_tess_evaluation_input_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS_EXT pname!");

	gl.getIntegerv(m_glExtTokens.MAX_TESS_EVALUATION_OUTPUT_COMPONENTS,
				   &m_gl_max_tess_evaluation_output_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(),
						"glGetIntegerv() failed for GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT pname!");

	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS,
				   &m_gl_max_transform_feedback_interleaved_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(),
						"glGetIntegerv() failed for GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS pname!");

	/* Sanity checks */
	DE_ASSERT(m_gl_max_vertex_output_components_value != 0);
	DE_ASSERT(m_gl_max_tess_control_input_components_value != 0);
	DE_ASSERT(m_gl_max_tess_control_output_components_value != 0);
	DE_ASSERT(m_gl_max_tess_patch_components_value != 0);
	DE_ASSERT(m_gl_max_tess_evaluation_input_components_value != 0);
	DE_ASSERT(m_gl_max_tess_evaluation_output_components_value != 0);
	DE_ASSERT(m_gl_max_transform_feedback_interleaved_components_value != 0);

	/* Make sure it is possible to transfer all components through all the stages.
	 * If not, the test may fail, so we throw not supported. */
	if (m_gl_max_vertex_output_components_value < m_gl_max_tess_control_input_components_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Warning: GL_MAX_VERTEX_OUTPUT_COMPONENTS value:"
						   << m_gl_max_vertex_output_components_value
						   << " is less than GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT: "
						   << m_gl_max_tess_control_input_components_value
						   << ". It may not be possible to pass all GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT "
							  "per-vertex components from Vertex Shader to Tessellation Control Shader."
						   << tcu::TestLog::EndMessage;
		throw tcu::NotSupportedError("GL_MAX_VERTEX_OUTPUT_COMPONENTS < GL_MAX_TESS_CONTROL_INPUT_COMPONENTS");
	}

	if (m_gl_max_tess_control_output_components_value != m_gl_max_tess_evaluation_input_components_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Warning: GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT:"
						   << m_gl_max_tess_control_output_components_value
						   << " is not equal to GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS_EXT:"
						   << m_gl_max_tess_evaluation_input_components_value
						   << ". It may not be possible to pass all GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT "
							  "per-vertex components from Tessellation Control Shader to Tessellation "
							  "Evaluation Shader."
						   << tcu::TestLog::EndMessage;
		throw tcu::NotSupportedError("GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS != "
									 "GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS");
	}

	if (m_gl_max_tess_evaluation_output_components_value > m_gl_max_transform_feedback_interleaved_components_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Warning: GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT:"
						   << m_gl_max_tess_evaluation_output_components_value
						   << " is greater than GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS:"
						   << m_gl_max_transform_feedback_interleaved_components_value
						   << ". It may not be possible to check all GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT "
							  "per-vertex components from Tessellation Evaluation Shader."
						   << tcu::TestLog::EndMessage;
		throw tcu::NotSupportedError("GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS > "
									 "GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS");
	}
}